

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulatingstroker.cpp
# Opt level: O0

void __thiscall QTriangulatingStroker::endCap(QTriangulatingStroker *this,qreal *param_2)

{
  long lVar1;
  int iVar2;
  qsizetype qVar3;
  size_type sVar4;
  QVarLengthArray<float,_256LL> *in_RSI;
  QDataBuffer<float> *in_RDI;
  long in_FS_OFFSET;
  int end;
  int front;
  int count;
  QVarLengthArray<float,_256LL> points;
  float in_stack_fffffffffffffb98;
  float in_stack_fffffffffffffb9c;
  float in_stack_fffffffffffffba0;
  float in_stack_fffffffffffffba4;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  int local_43c;
  int local_438;
  QDataBuffer<float> *pQVar6;
  float in_stack_fffffffffffffbe0;
  float in_stack_fffffffffffffbe4;
  float in_stack_fffffffffffffbe8;
  float in_stack_fffffffffffffbec;
  QTriangulatingStroker *in_stack_fffffffffffffbf0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = *(int *)(in_RDI + 100);
  if (iVar2 != 0) {
    if (iVar2 == 0x10) {
      emitLineSegment((QTriangulatingStroker *)
                      CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                      in_stack_fffffffffffffba4,in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
                      in_stack_fffffffffffffb98);
    }
    else if (iVar2 == 0x20) {
      pQVar6 = in_RDI;
      memset(&stack0xfffffffffffffbe0,0xaa,0x418);
      QVarLengthArray<float,_256LL>::QVarLengthArray
                ((QVarLengthArray<float,_256LL> *)&stack0xfffffffffffffbe0);
      qVar3 = QDataBuffer<float>::size(in_RDI);
      iVar2 = (int)qVar3;
      uVar5 = *(undefined4 *)(in_RDI + 0x18);
      QDataBuffer<float>::at(in_RDI,(long)(iVar2 + -2));
      QDataBuffer<float>::at(in_RDI,(long)(iVar2 + -1));
      QDataBuffer<float>::at(in_RDI,(long)(iVar2 + -4));
      QDataBuffer<float>::at(in_RDI,(long)(iVar2 + -3));
      arcPoints(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8,
                in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0,(float)((ulong)pQVar6 >> 0x20),
                SUB84(pQVar6,0),in_RSI);
      local_438 = 0;
      sVar4 = QVLABaseBase::size((QVLABaseBase *)&stack0xfffffffffffffbe0);
      local_43c = (int)(sVar4 / 2);
      for (; local_438 != local_43c; local_438 = local_438 + 1) {
        QVLABase<float>::operator[]
                  ((QVLABase<float> *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   0x6728fd);
        QDataBuffer<float>::add
                  ((QDataBuffer<float> *)CONCAT44(uVar5,in_stack_fffffffffffffba0),
                   (float *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
        QVLABase<float>::operator[]
                  ((QVLABase<float> *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   0x672920);
        QDataBuffer<float>::add
                  ((QDataBuffer<float> *)CONCAT44(uVar5,in_stack_fffffffffffffba0),
                   (float *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
        local_43c = local_43c + -1;
        if (local_438 == local_43c) break;
        QVLABase<float>::operator[]
                  ((QVLABase<float> *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   0x67295a);
        QDataBuffer<float>::add
                  ((QDataBuffer<float> *)CONCAT44(uVar5,in_stack_fffffffffffffba0),
                   (float *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
        QVLABase<float>::operator[]
                  ((QVLABase<float> *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   0x67297d);
        QDataBuffer<float>::add
                  ((QDataBuffer<float> *)CONCAT44(uVar5,in_stack_fffffffffffffba0),
                   (float *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      }
      QVarLengthArray<float,_256LL>::~QVarLengthArray
                ((QVarLengthArray<float,_256LL> *)CONCAT44(uVar5,in_stack_fffffffffffffba0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTriangulatingStroker::endCap(const qreal *)
{
    switch (m_cap_style) {
    case Qt::FlatCap:
        break;
    case Qt::SquareCap:
        emitLineSegment(m_cx + m_nvy, m_cy - m_nvx, m_nvx, m_nvy);
        break;
    case Qt::RoundCap: {
        QVarLengthArray<float> points;
        int count = m_vertices.size();
        arcPoints(m_cx, m_cy, m_vertices.at(count - 2), m_vertices.at(count - 1), m_vertices.at(count - 4), m_vertices.at(count - 3), points);
        int front = 0;
        int end = points.size() / 2;
        while (front != end) {
            m_vertices.add(points[2 * end - 2]);
            m_vertices.add(points[2 * end - 1]);
            --end;
            if (front == end)
                break;
            m_vertices.add(points[2 * front + 0]);
            m_vertices.add(points[2 * front + 1]);
            ++front;
        }
        break; }
    default: break; // to shut gcc up...
    }
}